

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::StorageImage::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  undefined1 *this;
  int iVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  RefData<vk::Handle<(vk::HandleType)8>_> data_01;
  RefData<vk::Handle<(vk::HandleType)8>_> data_02;
  VkPhysicalDevice pVVar2;
  InstanceInterface *pIVar3;
  CaseDef *pCVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  TestContext *pTVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  VkDeviceSize bufferSize;
  Handle<(vk::HandleType)8> *pHVar12;
  Allocation *pAVar13;
  VkDeviceMemory memory;
  VkDeviceSize VVar14;
  void *pvVar15;
  MovePtr *pMVar16;
  allocator<char> local_659;
  string local_658;
  undefined4 local_638;
  allocator<char> local_631;
  string local_630;
  ConstPixelBufferAccess local_610;
  ConstPixelBufferAccess local_5e8;
  TextureFormat local_5c0;
  undefined1 local_5b8 [8];
  ConstPixelBufferAccess layeredImageTwo;
  undefined1 local_588 [8];
  PixelBufferAccess layeredImageOne;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_530;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_520;
  undefined1 local_510 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> resolveImageTwoBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_4e0;
  undefined1 local_4c0 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> resolveImageTwoBuffer;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_490;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_480;
  undefined1 local_470 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> resolveImageOneBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_440;
  undefined1 local_420 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> resolveImageOneBuffer;
  VkDeviceSize resolveBufferSize;
  string local_3e8;
  allocator<char> local_3b1;
  string local_3b0;
  LogSection local_390;
  MessageBuilder local_350;
  MessageBuilder local_1d0;
  TestLog *local_50;
  TestLog *log;
  Allocator *allocator;
  VkPhysicalDevice physDevice;
  VkDevice device;
  InstanceInterface *vki;
  DeviceInterface *vk;
  CaseDef *caseDef_local;
  Context *context_local;
  
  vk = (DeviceInterface *)caseDef;
  caseDef_local = (CaseDef *)context;
  context_local = (Context *)__return_storage_ptr__;
  vki = (InstanceInterface *)Context::getDeviceInterface(context);
  device = (VkDevice)Context::getInstanceInterface((Context *)caseDef_local);
  physDevice = (VkPhysicalDevice)Context::getDevice((Context *)caseDef_local);
  allocator = (Allocator *)Context::getPhysicalDevice((Context *)caseDef_local);
  log = (TestLog *)Context::getDefaultAllocator((Context *)caseDef_local);
  checkImageFormatRequirements
            ((InstanceInterface *)device,(VkPhysicalDevice)allocator,caseDef->numSamples,
             caseDef->colorFormat,0x18);
  pTVar9 = Context::getTestContext((Context *)caseDef_local);
  pTVar10 = tcu::TestContext::getLog(pTVar9);
  local_50 = pTVar10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"Description",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"",(allocator<char> *)((long)&resolveBufferSize + 7));
  tcu::LogSection::LogSection(&local_390,&local_3b0,&local_3e8);
  pTVar10 = tcu::TestLog::operator<<(pTVar10,&local_390);
  tcu::TestLog::operator<<(&local_350,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (&local_350,
                       (char (*) [117])
                       "Rendering to a multisampled image. Image will be processed with a compute shader using OpImageRead and OpImageWrite."
                      );
  pTVar10 = tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_1d0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (&local_1d0,
                       (char (*) [115])
                       "Expecting the processed image to be roughly the same as the input image (deviation may occur for integer formats)."
                      );
  pTVar10 = tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(pTVar10,(EndSectionToken *)&tcu::TestLog::EndSection);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  tcu::MessageBuilder::~MessageBuilder(&local_350);
  tcu::LogSection::~LogSection(&local_390);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&resolveBufferSize + 7));
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  iVar6 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  iVar7 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  iVar1 = caseDef->numLayers;
  resolveImageOneBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::mapVkFormat(caseDef->colorFormat);
  iVar8 = tcu::getPixelSize((TextureFormat)
                            resolveImageOneBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                            m_data.deleter.m_allocator);
  bufferSize = (VkDeviceSize)(iVar6 * iVar7 * iVar1 * iVar8);
  this = &resolveImageOneBufferAlloc.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8;
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)this,(DeviceInterface *)vki,
             (VkDevice)physDevice,bufferSize,2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_440,(Move *)this);
  data_01.deleter.m_deviceIface = local_440.deleter.m_deviceIface;
  data_01.object.m_internal = local_440.object.m_internal;
  data_01.deleter.m_device = local_440.deleter.m_device;
  data_01.deleter.m_allocator = local_440.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_420,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &resolveImageOneBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  pMVar16 = (MovePtr *)vki;
  pVVar2 = physDevice;
  pTVar10 = log;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_420);
  resolveImageTwoBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_490,
             (DeviceInterface *)pMVar16,(VkDevice)pVVar2,(Allocator *)pTVar10,
             (VkBuffer)pHVar12->m_internal,::vk::MemoryRequirement::HostVisible);
  local_480 = de::details::MovePtr::operator_cast_to_PtrData(&local_490,pMVar16);
  data._8_8_ = local_440.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_440.object.m_internal;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_470,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_490);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
             &resolveImageTwoBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,(DeviceInterface *)vki,(VkDevice)physDevice,bufferSize,2);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4e0,
             (Move *)&resolveImageTwoBufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  data_02.deleter.m_deviceIface = local_4e0.deleter.m_deviceIface;
  data_02.object.m_internal = local_4e0.object.m_internal;
  data_02.deleter.m_device = local_4e0.deleter.m_device;
  data_02.deleter.m_allocator = local_4e0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_4c0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &resolveImageTwoBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  pMVar16 = (MovePtr *)vki;
  pVVar2 = physDevice;
  pTVar10 = log;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_4c0);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_530,
             (DeviceInterface *)pMVar16,(VkDevice)pVVar2,(Allocator *)pTVar10,
             (VkBuffer)pHVar12->m_internal,::vk::MemoryRequirement::HostVisible);
  local_520 = de::details::MovePtr::operator_cast_to_PtrData(&local_530,pMVar16);
  data_00._8_8_ = local_4e0.deleter.m_deviceIface;
  data_00.ptr = (Allocation *)local_4e0.object.m_internal;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_510,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_530);
  pIVar3 = vki;
  pVVar2 = physDevice;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator*
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_470)
  ;
  zeroBuffer((DeviceInterface *)pIVar3,(VkDevice)pVVar2,pAVar13,bufferSize);
  pIVar3 = vki;
  pVVar2 = physDevice;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator*
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_510)
  ;
  zeroBuffer((DeviceInterface *)pIVar3,(VkDevice)pVVar2,pAVar13,bufferSize);
  pCVar4 = caseDef_local;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_420);
  renderAndResolve((Context *)pCVar4,caseDef,(VkBuffer)pHVar12->m_internal,false);
  pCVar4 = caseDef_local;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_4c0);
  renderAndResolve((Context *)pCVar4,caseDef,(VkBuffer)pHVar12->m_internal,true);
  pIVar3 = vki;
  pVVar2 = physDevice;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_470)
  ;
  memory = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_470)
  ;
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)pIVar3,(VkDevice)pVVar2,memory,VVar14,bufferSize);
  pIVar3 = vki;
  pVVar2 = physDevice;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_510)
  ;
  layeredImageOne.super_ConstPixelBufferAccess.m_data = (void *)::vk::Allocation::getMemory(pAVar13)
  ;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_510)
  ;
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)pIVar3,(VkDevice)pVVar2,
             (VkDeviceMemory)layeredImageOne.super_ConstPixelBufferAccess.m_data,VVar14,bufferSize);
  layeredImageTwo.m_data = (void *)::vk::mapVkFormat(caseDef->colorFormat);
  iVar6 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  iVar7 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  iVar1 = caseDef->numLayers;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_470)
  ;
  pvVar15 = ::vk::Allocation::getHostPtr(pAVar13);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_588,(TextureFormat *)&layeredImageTwo.m_data,iVar6,iVar7,
             iVar1,pvVar15);
  local_5c0 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar6 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  iVar7 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  iVar1 = caseDef->numLayers;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_510)
  ;
  pvVar15 = ::vk::Allocation::getHostPtr(pAVar13);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_5b8,&local_5c0,iVar6,iVar7,iVar1,pvVar15);
  pTVar9 = Context::getTestContext((Context *)caseDef_local);
  pTVar10 = tcu::TestContext::getLog(pTVar9);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_5e8,(ConstPixelBufferAccess *)local_588);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_610,(ConstPixelBufferAccess *)local_5b8);
  bVar5 = compareImages(pTVar10,caseDef,&local_5e8,&local_610);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"OK",&local_659);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator(&local_659);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"Rendered images are not correct",&local_631);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
  }
  local_638 = 1;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_510);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_4c0);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_470);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_420);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkDevice				device				= context.getDevice();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	Allocator&					allocator			= context.getDefaultAllocator();

	checkImageFormatRequirements(vki, physDevice, caseDef.numSamples, caseDef.colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_STORAGE_BIT);

	{
		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogSection("Description", "")
			<< tcu::TestLog::Message << "Rendering to a multisampled image. Image will be processed with a compute shader using OpImageRead and OpImageWrite." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Expecting the processed image to be roughly the same as the input image (deviation may occur for integer formats)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::EndSection;
	}

	// Host-readable buffer
	const VkDeviceSize				resolveBufferSize			= caseDef.renderSize.x() * caseDef.renderSize.y() * caseDef.numLayers * tcu::getPixelSize(mapVkFormat(caseDef.colorFormat));
	const Unique<VkBuffer>			resolveImageOneBuffer		(makeBuffer(vk, device, resolveBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		resolveImageOneBufferAlloc	(bindBuffer(vk, device, allocator, *resolveImageOneBuffer, MemoryRequirement::HostVisible));
	const Unique<VkBuffer>			resolveImageTwoBuffer		(makeBuffer(vk, device, resolveBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		resolveImageTwoBufferAlloc	(bindBuffer(vk, device, allocator, *resolveImageTwoBuffer, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *resolveImageOneBufferAlloc, resolveBufferSize);
	zeroBuffer(vk, device, *resolveImageTwoBufferAlloc, resolveBufferSize);

	// Render: repeat the same rendering twice to avoid non-essential API calls and layout transitions (e.g. copy).
	{
		renderAndResolve(context, caseDef, *resolveImageOneBuffer, false);	// Pass 1: render a basic multisampled image
		renderAndResolve(context, caseDef, *resolveImageTwoBuffer, true);	// Pass 2: the same but altered with a compute shader
	}

	// Verify
	{
		invalidateMappedMemoryRange(vk, device, resolveImageOneBufferAlloc->getMemory(), resolveImageOneBufferAlloc->getOffset(), resolveBufferSize);
		invalidateMappedMemoryRange(vk, device, resolveImageTwoBufferAlloc->getMemory(), resolveImageTwoBufferAlloc->getOffset(), resolveBufferSize);

		const tcu::PixelBufferAccess		layeredImageOne	(mapVkFormat(caseDef.colorFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), caseDef.numLayers, resolveImageOneBufferAlloc->getHostPtr());
		const tcu::ConstPixelBufferAccess	layeredImageTwo	(mapVkFormat(caseDef.colorFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), caseDef.numLayers, resolveImageTwoBufferAlloc->getHostPtr());

		// Check all layers
		if (!compareImages(context.getTestContext().getLog(), caseDef, layeredImageOne, layeredImageTwo))
			return tcu::TestStatus::fail("Rendered images are not correct");
	}

	return tcu::TestStatus::pass("OK");
}